

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall mjs::object::put(object *this,string *name,value *val,property_attribute attr)

{
  bool bVar1;
  undefined4 in_EAX;
  uint *puVar2;
  property *ppVar3;
  object *this_00;
  gc_vector<mjs::object::property> *this_01;
  int iVar4;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar5;
  wstring_view key;
  wstring_view key_00;
  gc_heap_ptr_untracked<mjs::object,_true> p;
  gc_heap_ptr_untracked<mjs::object,_true> local_38;
  property_attribute local_34;
  
  _local_38 = CONCAT44(attr,in_EAX);
  puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
  key._M_len = (ulong)*puVar2;
  key._M_str = (wchar_t *)(puVar2 + 1);
  pVar5 = find(this,key);
  ppVar3 = pVar5.first;
  if (ppVar3 != (property *)0x0) {
    bVar1 = has_attributes(ppVar3->attributes_,read_only);
    if (!bVar1) {
      property::put(ppVar3,this,val);
    }
    if (ppVar3 != (property *)0x0) {
      return;
    }
  }
  _local_38 = CONCAT44(local_34,(this->prototype_).pos_);
  do {
    if (local_38.pos_ == 0) {
      iVar4 = 2;
      break;
    }
    this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&local_38,this->heap_);
    puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
    key_00._M_len = (ulong)*puVar2;
    key_00._M_str = (wchar_t *)(puVar2 + 1);
    pVar5 = find(this_00,key_00);
    ppVar3 = pVar5.first;
    if (ppVar3 == (property *)0x0) {
      iVar4 = 0;
    }
    else {
      bVar1 = has_attributes(ppVar3->attributes_,accessor);
      iVar4 = 2;
      if (bVar1) {
        property::put(ppVar3,this,val);
        iVar4 = 1;
      }
    }
    if (ppVar3 == (property *)0x0) {
      _local_38 = CONCAT44(local_34,(this_00->prototype_).pos_);
      iVar4 = 0;
    }
  } while (iVar4 == 0);
  if ((iVar4 == 2) && (this->extensible_ == true)) {
    this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                        (&this->properties_,this->heap_);
    gc_vector<mjs::object::property>::
    emplace_back<mjs::string_const&,mjs::value_const&,mjs::property_attribute&>
              (this_01,name,val,&local_34);
  }
  return;
}

Assistant:

void object::put(const string& name, const value& val, property_attribute attr) {
    //ES5.1, 8.12.5

    // See if there is already a property with this name
    if (auto it = find(name.view()).first; it) {
        if (has_attributes(it->attributes(), property_attribute::read_only)) {
            return;
        }
        it->put(*this, val);
        return;
    }

    // Check if there is an accessor property in a prototype
    for (auto p = prototype_; p; ) {
        auto& proto = p.dereference(heap());
        if (auto it = proto.find(name.view()).first) {
            if (has_attributes(it->attributes(), property_attribute::accessor)) {
                it->put(*this, val);
                return;
            }
            // Handle as insertion
            break;
        }
        p = proto.prototype_;
    }

    // Normal insertion
    if (extensible_) {
        properties_.dereference(heap()).emplace_back(name, val, attr);
    }
}